

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O2

void __thiscall Log_Cerr_Buffer::~Log_Cerr_Buffer(Log_Cerr_Buffer *this)

{
  std::__cxx11::stringbuf::~stringbuf((stringbuf *)this);
  operator_delete(this);
  return;
}

Assistant:

int sync()
    {
        if(!Instance()->suppress_cerr){
            if(Log_Entry::start_on_separate_line) putchar('\n');Log_Entry::start_on_separate_line=false;
            fputs(str().c_str(),stderr);}
        if(Instance()->log_file){
            if(Log_Entry::log_file_start_on_separate_line) putc('\n',Instance()->log_file);Log_Entry::log_file_start_on_separate_line=false;
            std::string buffer=str();
            for(size_t start=0;start<buffer.length();){
                size_t end=buffer.find('\n',start);
                if(Instance()->xml) fputs("<error><!--",Instance()->log_file);
                fputs(buffer.substr(start,end-start).c_str(),Instance()->log_file);
                if(Instance()->xml) fputs("--></error>",Instance()->log_file);
                putc('\n',Instance()->log_file);
                if(end!=std::string::npos) start=end+1;
                else break;}}
        str("");return std::stringbuf::sync();
    }